

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++:623:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_test_c__:623:17)>
             *this)

{
  Maybe<kj::_::Mutex::Waiter_&> local_10;
  
  anon_unknown_0::delay();
  MutexGuarded<unsigned_int>::lockExclusive
            ((MutexGuarded<unsigned_int> *)&stack0xffffffffffffffe8,(this->f).guarded);
  *(uint *)&((local_10.ptr)->next).ptr = 1;
  Locked<unsigned_int>::~Locked((Locked<unsigned_int> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }